

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O1

void __thiscall
ft::
vector<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::push_back(vector<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::allocator<ft::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            *this,value_type *val)

{
  pointer ppVar1;
  pointer ppVar2;
  size_type sVar3;
  pointer pcVar4;
  size_t in_RDX;
  
  if (this->m_capacity <= this->m_size) {
    realloc(this,(void *)(this->m_capacity * 2),in_RDX);
  }
  ppVar2 = this->m_data;
  sVar3 = this->m_size;
  ppVar1 = ppVar2 + sVar3;
  (ppVar1->first)._M_dataplus._M_p = (pointer)&(ppVar1->first).field_2;
  pcVar4 = (val->first)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(ppVar2 + sVar3),pcVar4,pcVar4 + (val->first)._M_string_length);
  ppVar1->second = val->second;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void		push_back(value_type const & val) {
		if (this->size() >= this->capacity())
			this->realloc(this->capacity() * 2);
		this->get_allocator().construct(this->m_data + this->size(), val);
		++this->m_size;
	}